

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void custom_compare_primitive_test(void)

{
  fdb_doc *pfVar1;
  double dVar2;
  fdb_status fVar3;
  size_t sVar4;
  ulong uVar5;
  char *__format;
  fdb_doc **doc;
  long lVar6;
  double dVar7;
  double local_3e0;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  double local_3c8;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_doc *local_388 [10];
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  
  uVar5 = 0;
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.multi_kv_instances = true;
  kvs_config.custom_cmp = _cmp_double;
  fdb_open(&dbfile,"./dummy1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar3 = fdb_set_log_callback(db,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x973);
    custom_compare_primitive_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x973,"void custom_compare_primitive_test()");
  }
  doc = local_388;
  for (lVar6 = 0; lVar6 != 0x6e; lVar6 = lVar6 + 0xb) {
    local_3e0 = 10000.0 / (double)(int)lVar6;
    keybuf._0_8_ = local_3e0;
    sprintf(bodybuf,"value: %d, %f",local_3e0,uVar5);
    sVar4 = strlen(bodybuf);
    fdb_doc_create(doc,keybuf,8,(void *)0x0,0,bodybuf,sVar4 + 1);
    fdb_set(db,*doc);
    doc = doc + 1;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  local_3c8 = local_3e0;
  fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
  dVar7 = -1.0;
  while( true ) {
    fVar3 = fdb_iterator_get(iterator,&rdoc);
    pfVar1 = rdoc;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x983);
      custom_compare_primitive_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x983,"void custom_compare_primitive_test()");
    }
    memcpy(&local_3c8,rdoc->key,rdoc->keylen);
    dVar2 = local_3c8;
    if (local_3c8 <= dVar7) break;
    fdb_doc_free(pfVar1);
    rdoc = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next(iterator);
    dVar7 = dVar2;
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close(iterator);
      fdb_commit(dbfile,'\x01');
      fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
      dVar7 = -1.0;
      while( true ) {
        fVar3 = fdb_iterator_get(iterator,&rdoc);
        pfVar1 = rdoc;
        if (fVar3 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x993);
          custom_compare_primitive_test()::__test_pass = 1;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x993,"void custom_compare_primitive_test()");
        }
        memcpy(&local_3c8,rdoc->key,rdoc->keylen);
        dVar2 = local_3c8;
        if (local_3c8 <= dVar7) break;
        fdb_doc_free(pfVar1);
        rdoc = (fdb_doc *)0x0;
        fVar3 = fdb_iterator_next(iterator);
        dVar7 = dVar2;
        if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
          fdb_iterator_close(iterator);
          fdb_compact(dbfile,"./dummy2");
          fdb_iterator_init(db,&iterator,(void *)0x0,0,(void *)0x0,0,0);
          dVar7 = -1.0;
          while( true ) {
            fVar3 = fdb_iterator_get(iterator,&rdoc);
            pfVar1 = rdoc;
            if (fVar3 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x9a4);
              custom_compare_primitive_test()::__test_pass = 1;
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x9a4,"void custom_compare_primitive_test()");
            }
            memcpy(&local_3c8,rdoc->key,rdoc->keylen);
            dVar2 = local_3c8;
            if (local_3c8 <= dVar7) break;
            fdb_doc_free(pfVar1);
            rdoc = (fdb_doc *)0x0;
            fVar3 = fdb_iterator_next(iterator);
            dVar7 = dVar2;
            if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
              fdb_iterator_close(iterator);
              fdb_kvs_close(db);
              fdb_close(dbfile);
              for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
                fdb_doc_free(local_388[lVar6]);
              }
              fdb_shutdown();
              memleak_end();
              __format = "%s PASSED\n";
              if (custom_compare_primitive_test()::__test_pass != '\0') {
                __format = "%s FAILED\n";
              }
              fprintf(_stderr,__format,"custom compare function for primitive key test");
              return;
            }
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x9a6);
          custom_compare_primitive_test()::__test_pass = 1;
          __assert_fail("key_double > key_double_prev",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x9a6,"void custom_compare_primitive_test()");
        }
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x995);
      custom_compare_primitive_test()::__test_pass = 1;
      __assert_fail("key_double > key_double_prev",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x995,"void custom_compare_primitive_test()");
    }
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x985);
  custom_compare_primitive_test()::__test_pass = 1;
  __assert_fail("key_double > key_double_prev",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x985,"void custom_compare_primitive_test()");
}

Assistant:

void custom_compare_primitive_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    double key_double, key_double_prev;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    kvs_config.custom_cmp = _cmp_double;

    // open db with custom compare function for double key type
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_primitive_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        key_double = 10000/(i*11.0);
        memcpy(keybuf, &key_double, sizeof(key_double));
        sprintf(bodybuf, "value: %d, %f", i, key_double);
        fdb_doc_create(&doc[i], (void*)keybuf, sizeof(key_double), NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for primitive key test");
}